

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.h
# Opt level: O1

R __thiscall QBitArray::bitLocation<QBitArray>(QBitArray *this,QBitArray *ba,qsizetype i)

{
  qsizetype extraout_RDX;
  R RVar1;
  
  if ((*(int **)this == (int *)0x0) || (1 < **(int **)this)) {
    QByteArray::reallocData((longlong)this,(AllocationOption)*(undefined8 *)(this + 0x10));
    i = extraout_RDX;
  }
  RVar1._9_7_ = (undefined7)((ulong)i >> 8);
  RVar1.bitMask = '\x01' << ((byte)ba & 7);
  RVar1.byte = (char *)(((long)ba >> 3) + *(long *)(this + 8) + 1);
  return RVar1;
}

Assistant:

static auto bitLocation(BitArray &ba, qsizetype i)
    {
        Q_ASSERT(size_t(i) < size_t(ba.size()));
        struct R {
            decltype(ba.d[1]) byte;
            uchar bitMask;
        };
        qsizetype byteIdx = i >> 3;
        qsizetype bitIdx = i & 7;
        return R{ ba.d[1 + byteIdx], uchar(1U << bitIdx) };
    }